

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::SortByMaterials_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSplitGroupData_MDL7 *splitGroupData)

{
  pointer ppaVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  iterator iVar3;
  pointer paVar4;
  uint uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  Logger *pLVar7;
  pointer pIVar8;
  MDLImporter *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar9;
  MDLImporter *this_01;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_02;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> avMats;
  IntMaterial_MDL7 sHelper;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  aiTempSplit;
  uint local_8c;
  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> local_88;
  uint local_64;
  IntGroupInfo_MDL7 *local_60;
  IntMaterial_MDL7 local_58;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_48;
  
  uVar11 = (long)(splitGroupData->shared->pcMats).
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(splitGroupData->shared->pcMats).
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar13 = (long)uVar11 >> 3;
  uVar12 = (uint)uVar13;
  local_60 = groupInfo;
  if (groupData->bNeed2UV == false) {
    paVar4 = (groupData->vTextureCoords2).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((groupData->vTextureCoords2).
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish != paVar4) {
      (groupData->vTextureCoords2).
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = paVar4;
    }
    ppvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              operator_new__(uVar11 & 0x7fffffff8);
    splitGroupData->aiSplit = ppvVar9;
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        splitGroupData->aiSplit[uVar11] = pvVar6;
        uVar11 = uVar11 + 1;
      } while ((uVar13 & 0xffffffff) != uVar11);
    }
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_88.
                          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    if (local_60->pcGroup->numtris != 0) {
      uVar5 = 0;
      do {
        uVar10 = (groupData->pcFaces).
                 super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5].iMatIndex[0];
        if (uVar10 < uVar12) {
          pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   splitGroupData->aiSplit[uVar10];
          iVar3._M_current = *(uint **)(pvVar2 + 8);
          if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,(uint *)&local_88);
          }
          else {
            *iVar3._M_current = uVar5;
            *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 4;
          }
        }
        else {
          pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   splitGroupData->aiSplit[uVar12 - 1];
          iVar3._M_current = *(uint **)(pvVar2 + 8);
          if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,(uint *)&local_88);
          }
          else {
            *iVar3._M_current = uVar5;
            *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 4;
          }
          if ((groupData->pcFaces).
              super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(ulong)local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffff].iMatIndex[0] !=
              0xffffffff) {
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,"Index overflow in MDL7 material list [#0]");
          }
        }
        uVar5 = (int)local_88.
                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
        local_88.
        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar5);
      } while (uVar5 < (uint)local_60->pcGroup->numtris);
    }
  }
  else {
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_start = (IntMaterial_MDL7 *)0x0;
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_finish = (IntMaterial_MDL7 *)0x0;
    local_88.
    super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (IntMaterial_MDL7 *)0x0;
    uVar11 = (ulong)((uint)(uVar11 >> 2) & 0xfffffffe);
    std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
    reserve(&local_88,uVar11);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::vector(&local_48,uVar11,(allocator_type *)&local_58);
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11] = pvVar6;
        uVar11 = uVar11 + 1;
      } while ((uVar13 & 0xffffffff) != uVar11);
    }
    local_8c = 0;
    if (local_60->pcGroup->numtris != 0) {
      local_64 = uVar12 - 1;
      do {
        uVar5 = (groupData->pcFaces).
                super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                ._M_impl.super__Vector_impl_data._M_start[local_8c].iMatIndex[0];
        uVar10 = uVar5;
        if ((uVar12 <= uVar5) && (uVar10 = local_64, uVar5 != 0xffffffff)) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"Index overflow in MDL7 material list [#1]");
          uVar10 = local_64;
        }
        uVar5 = (groupData->pcFaces).
                super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                ._M_impl.super__Vector_impl_data._M_start[local_8c].iMatIndex[1];
        if ((uVar5 == 0xffffffff) || (uVar10 == uVar5)) {
          uVar11 = (ulong)uVar10;
        }
        else {
          if (uVar12 <= uVar5) {
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,"Index overflow in MDL7 material list [#2]");
            uVar5 = local_64;
          }
          if (local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar11 = 0;
            pIVar8 = local_88.
                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((pIVar8->iOldMatIndices[0] == uVar10) && (pIVar8->iOldMatIndices[1] == uVar5))
              goto LAB_0048757a;
              pIVar8 = pIVar8 + 1;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (pIVar8 != local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_58.pcMat = (aiMaterial *)0x0;
          local_58.iOldMatIndices[0] = 0;
          local_58.iOldMatIndices[1] = 0;
          this_00 = (MDLImporter *)operator_new(0x10);
          this_01 = this_00;
          aiMaterial::aiMaterial((aiMaterial *)this_00);
          local_58.iOldMatIndices[1] = uVar5;
          local_58.iOldMatIndices[0] = uVar10;
          ppaVar1 = (splitGroupData->shared->pcMats).
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_58.pcMat = (aiMaterial *)this_00;
          JoinSkins_3DGS_MDL7(this_01,ppaVar1[uVar10],ppaVar1[uVar5],(aiMaterial *)this_00);
          if (local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::MDL::IntMaterial_MDL7,std::allocator<Assimp::MDL::IntMaterial_MDL7>>
            ::_M_realloc_insert<Assimp::MDL::IntMaterial_MDL7_const&>
                      ((vector<Assimp::MDL::IntMaterial_MDL7,std::allocator<Assimp::MDL::IntMaterial_MDL7>>
                        *)&local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_58);
          }
          else {
            *(undefined4 *)
             &(local_88.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_finish)->pcMat = local_58.pcMat._0_4_;
            *(undefined4 *)
             ((long)&(local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->pcMat + 4) = local_58.pcMat._4_4_
            ;
            (local_88.
             super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
             ._M_impl.super__Vector_impl_data._M_finish)->iOldMatIndices[0] =
                 local_58.iOldMatIndices[0];
            (local_88.
             super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
             ._M_impl.super__Vector_impl_data._M_finish)->iOldMatIndices[1] =
                 local_58.iOldMatIndices[1];
            local_88.
            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = (ulong)((int)((ulong)((long)local_88.
                                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_88.
                                              super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1);
LAB_0048757a:
          if ((long)local_48.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar11) {
            local_58.pcMat = (aiMaterial *)operator_new(0x18);
            (((MDLImporter *)local_58.pcMat)->super_BaseImporter)._vptr_BaseImporter =
                 (_func_int **)0x0;
            *(undefined8 *)
             &(((MDLImporter *)local_58.pcMat)->super_BaseImporter).importerUnits._M_t._M_impl = 0;
            *(undefined8 *)
             &(((MDLImporter *)local_58.pcMat)->super_BaseImporter).importerUnits._M_t._M_impl.
              super__Rb_tree_header._M_header = 0;
            std::
            vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
            ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        *)&local_48,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&local_58);
          }
        }
        pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 local_48.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11];
        iVar3._M_current = *(uint **)(pvVar2 + 8);
        if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,&local_8c);
        }
        else {
          *iVar3._M_current = local_8c;
          *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 4;
        }
        local_8c = local_8c + 1;
      } while (local_8c < (uint)local_60->pcGroup->numtris);
    }
    this_02 = &splitGroupData->shared->pcMats;
    if (local_60->iIndex == 0) {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (this_02,(long)local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.
                               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (local_88.
          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_88.
          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar5 = 1;
        uVar11 = 0;
        do {
          (splitGroupData->shared->pcMats).
          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] =
               local_88.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].pcMat;
          uVar11 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar11 < (ulong)((long)local_88.
                                        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    else {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (this_02,((long)local_88.
                                super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88.
                                super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) +
                         (uVar13 & 0xffffffff));
      uVar11 = uVar13 & 0xffffffff;
      uVar5 = uVar12;
      if (uVar11 < (ulong)((long)local_88.
                                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        do {
          (splitGroupData->shared->pcMats).
          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] =
               local_88.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].pcMat;
          uVar11 = (ulong)(uVar5 + 1);
          uVar5 = uVar5 + 1;
        } while (uVar11 < (ulong)((long)local_88.
                                        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    uVar11 = 0xffffffffffffffff;
    if (-1 < (long)local_48.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
      uVar11 = (long)local_48.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    ppvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)operator_new__(uVar11);
    splitGroupData->aiSplit = ppvVar9;
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        splitGroupData->aiSplit[uVar11] =
             local_48.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11];
        uVar11 = uVar11 + 1;
      } while ((uVar13 & 0xffffffff) != uVar11);
    }
    if (local_48.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.
        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
        ._M_impl.super__Vector_impl_data._M_start != (IntMaterial_MDL7 *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void MDLImporter::SortByMaterials_3DGS_MDL7(
    const MDL::IntGroupInfo_MDL7&   groupInfo,
    MDL::IntGroupData_MDL7&         groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const unsigned int iNumMaterials = (unsigned int)splitGroupData.shared.pcMats.size();
    if (!groupData.bNeed2UV)    {
        // if we don't need a second set of texture coordinates there is no reason to keep it in memory ...
        groupData.vTextureCoords2.clear();

        // allocate the array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[iNumMaterials];

        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            if (groupData.pcFaces[iFace].iMatIndex[0] >= iNumMaterials) {
                // use the last material instead
                splitGroupData.aiSplit[iNumMaterials-1]->push_back(iFace);

                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(0xFFFFFFFF != groupData.pcFaces[iFace].iMatIndex[0])
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#0]");
            }
            else splitGroupData.aiSplit[groupData.pcFaces[iFace].
                iMatIndex[0]]->push_back(iFace);
        }
    }
    else
    {
        // we need to build combined materials for each combination of
        std::vector<MDL::IntMaterial_MDL7> avMats;
        avMats.reserve(iNumMaterials*2);

        // fixme: why on the heap?
        std::vector<std::vector<unsigned int>* > aiTempSplit(iNumMaterials*2);
        for (unsigned int m = 0; m < iNumMaterials;++m)
            aiTempSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            unsigned int iMatIndex = groupData.pcFaces[iFace].iMatIndex[0];
            if (iMatIndex >= iNumMaterials) {
                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(UINT_MAX != iMatIndex)
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#1]");
                iMatIndex = iNumMaterials-1;
            }
            unsigned int iMatIndex2 = groupData.pcFaces[iFace].iMatIndex[1];

            unsigned int iNum = iMatIndex;
            if (UINT_MAX != iMatIndex2 && iMatIndex != iMatIndex2)  {
                if (iMatIndex2 >= iNumMaterials)    {
                    // sometimes MED writes -1, but normally only if there is only
                    // one skin assigned. No warning in this case
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#2]");
                    iMatIndex2 = iNumMaterials-1;
                }

                // do a slow search in the list ...
                iNum = 0;
                bool bFound = false;
                for (std::vector<MDL::IntMaterial_MDL7>::iterator i =  avMats.begin();i != avMats.end();++i,++iNum){
                    if ((*i).iOldMatIndices[0] == iMatIndex && (*i).iOldMatIndices[1] == iMatIndex2)    {
                        // reuse this material
                        bFound = true;
                        break;
                    }
                }
                if (!bFound)    {
                    //  build a new material ...
                    MDL::IntMaterial_MDL7 sHelper;
                    sHelper.pcMat = new aiMaterial();
                    sHelper.iOldMatIndices[0] = iMatIndex;
                    sHelper.iOldMatIndices[1] = iMatIndex2;
                    JoinSkins_3DGS_MDL7(splitGroupData.shared.pcMats[iMatIndex],
                        splitGroupData.shared.pcMats[iMatIndex2],sHelper.pcMat);

                    // and add it to the list
                    avMats.push_back(sHelper);
                    iNum = (unsigned int)avMats.size()-1;
                }
                // adjust the size of the file array
                if (iNum == aiTempSplit.size()) {
                    aiTempSplit.push_back(new std::vector<unsigned int>());
                }
            }
            aiTempSplit[iNum]->push_back(iFace);
        }

        // now add the newly created materials to the old list
        if (0 == groupInfo.iIndex)  {
            splitGroupData.shared.pcMats.resize(avMats.size());
            for (unsigned int o = 0; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }
        else    {
            // This might result in redundant materials ...
            splitGroupData.shared.pcMats.resize(iNumMaterials + avMats.size());
            for (unsigned int o = iNumMaterials; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }

        // and build the final face-to-material array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[aiTempSplit.size()];
        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = aiTempSplit[m];
    }
}